

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O2

void __thiscall llvm::Triple::Triple(Triple *this,Twine *Str)

{
  ArchType AVar1;
  SubArchType SVar2;
  VendorType VVar3;
  OSType OVar4;
  EnvironmentType EVar5;
  ObjectFormatType OVar6;
  SmallVector<llvm::StringRef,_4U> Components;
  StringRef local_20;
  
  Twine::str_abi_cxx11_(&this->Data,Str);
  this->Arch = UnknownArch;
  this->SubArch = NoSubArch;
  this->Vendor = UnknownVendor;
  this->OS = UnknownOS;
  this->Environment = UnknownEnvironment;
  this->ObjectFormat = UnknownObjectFormat;
  Components.super_SmallVectorImpl<llvm::StringRef>.
  super_SmallVectorTemplateBase<llvm::StringRef,_true>.
  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX =
       &Components.super_SmallVectorStorage<llvm::StringRef,_4U>;
  Components.super_SmallVectorImpl<llvm::StringRef>.
  super_SmallVectorTemplateBase<llvm::StringRef,_true>.
  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size = 0;
  Components.super_SmallVectorImpl<llvm::StringRef>.
  super_SmallVectorTemplateBase<llvm::StringRef,_true>.
  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Capacity = 4;
  local_20.Data = (this->Data)._M_dataplus._M_p;
  local_20.Length = (this->Data)._M_string_length;
  StringRef::split(&local_20,&Components.super_SmallVectorImpl<llvm::StringRef>,'-',3,true);
  if (Components.super_SmallVectorImpl<llvm::StringRef>.
      super_SmallVectorTemplateBase<llvm::StringRef,_true>.
      super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size != 0) {
    AVar1 = parseArch(*Components.super_SmallVectorImpl<llvm::StringRef>.
                       super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                       super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.
                       BeginX);
    this->Arch = AVar1;
    if (Components.super_SmallVectorImpl<llvm::StringRef>.
        super_SmallVectorTemplateBase<llvm::StringRef,_true>.
        super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size == 0) {
LAB_0014dd3a:
      __assert_fail("idx < size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                    ,0x9b,
                    "reference llvm::SmallVectorTemplateCommon<llvm::StringRef>::operator[](size_type) [T = llvm::StringRef]"
                   );
    }
    SVar2 = parseSubArch(*Components.super_SmallVectorImpl<llvm::StringRef>.
                          super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                          super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                          super_SmallVectorBase.BeginX);
    this->SubArch = SVar2;
    if (1 < Components.super_SmallVectorImpl<llvm::StringRef>.
            super_SmallVectorTemplateBase<llvm::StringRef,_true>.
            super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size) {
      VVar3 = parseVendor(*(StringRef *)
                           ((long)Components.super_SmallVectorImpl<llvm::StringRef>.
                                  super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                  super_SmallVectorBase.BeginX + 0x10));
      this->Vendor = VVar3;
      if (2 < Components.super_SmallVectorImpl<llvm::StringRef>.
              super_SmallVectorTemplateBase<llvm::StringRef,_true>.
              super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size) {
        OVar4 = parseOS(*(StringRef *)
                         ((long)Components.super_SmallVectorImpl<llvm::StringRef>.
                                super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                super_SmallVectorBase.BeginX + 0x20));
        this->OS = OVar4;
        if (3 < Components.super_SmallVectorImpl<llvm::StringRef>.
                super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size) {
          EVar5 = parseEnvironment(*(StringRef *)
                                    ((long)Components.super_SmallVectorImpl<llvm::StringRef>.
                                           super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                           super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                           super_SmallVectorBase.BeginX + 0x30));
          this->Environment = EVar5;
          if (Components.super_SmallVectorImpl<llvm::StringRef>.
              super_SmallVectorTemplateBase<llvm::StringRef,_true>.
              super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size < 4)
          goto LAB_0014dd3a;
          OVar6 = parseFormat(*(StringRef *)
                               ((long)Components.super_SmallVectorImpl<llvm::StringRef>.
                                      super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                      super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                      super_SmallVectorBase.BeginX + 0x30));
          this->ObjectFormat = OVar6;
          goto LAB_0014dd19;
        }
      }
    }
  }
  OVar6 = this->ObjectFormat;
LAB_0014dd19:
  if (OVar6 == UnknownObjectFormat) {
    OVar6 = getDefaultFormat(this);
    this->ObjectFormat = OVar6;
  }
  SmallVectorImpl<llvm::StringRef>::~SmallVectorImpl
            (&Components.super_SmallVectorImpl<llvm::StringRef>);
  return;
}

Assistant:

Triple::Triple(const Twine &Str)
    : Data(Str.str()), Arch(UnknownArch), SubArch(NoSubArch),
      Vendor(UnknownVendor), OS(UnknownOS), Environment(UnknownEnvironment),
      ObjectFormat(UnknownObjectFormat) {
  // Do minimal parsing by hand here.
  SmallVector<StringRef, 4> Components;
  StringRef(Data).split(Components, '-', /*MaxSplit*/ 3);
  if (Components.size() > 0) {
    Arch = parseArch(Components[0]);
    SubArch = parseSubArch(Components[0]);
    if (Components.size() > 1) {
      Vendor = parseVendor(Components[1]);
      if (Components.size() > 2) {
        OS = parseOS(Components[2]);
        if (Components.size() > 3) {
          Environment = parseEnvironment(Components[3]);
          ObjectFormat = parseFormat(Components[3]);
        }
      }
    }
  }
  if (ObjectFormat == UnknownObjectFormat)
    ObjectFormat = getDefaultFormat(*this);
}